

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalCSE.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_166::Applier::visitExpression(Applier *this,Expression *curr)

{
  bool bVar1;
  Index IVar2;
  pointer ppVar3;
  Function *func;
  mapped_type *pmVar4;
  Module *pMVar5;
  LocalSet *expression;
  size_type sVar6;
  LocalGet *expression_00;
  Builder local_60;
  mapped_type *local_58;
  mapped_type *originalInfo;
  Builder local_48;
  uintptr_t local_40;
  Index local_34;
  RequestInfo *pRStack_30;
  Index local;
  RequestInfo *info;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
  local_20;
  iterator iter;
  Expression *curr_local;
  Applier *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
             )(_Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
               )curr;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
       ::find(&(this->requestInfos).
               super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
              ,(key_type *)&iter);
  info = (RequestInfo *)
         std::
         unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
         ::end(&(this->requestInfos).
                super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
              );
  bVar1 = std::__detail::operator==
                    (&local_20,
                     (_Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                      *)&info);
  if (!bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false,_false>
             ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false,_false>
                           *)&local_20);
    pRStack_30 = &ppVar3->second;
    RequestInfo::validate(pRStack_30);
    if (pRStack_30->requests == 0) {
      if ((pRStack_30->original != (Expression *)0x0) &&
         (local_58 = std::
                     unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                     ::at(&(this->requestInfos).
                           super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                          ,&pRStack_30->original), local_58->requests != 0)) {
        sVar6 = std::
                unordered_map<wasm::Expression_*,_unsigned_int,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>_>
                ::count(&this->originalLocalMap,&pRStack_30->original);
        if (sVar6 == 0) {
          __assert_fail("originalLocalMap.count(info.original)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LocalCSE.cpp"
                        ,0x23d,
                        "void wasm::(anonymous namespace)::Applier::visitExpression(Expression *)");
        }
        pMVar5 = Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 ::getModule((Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                              *)this);
        Builder::Builder(&local_60,pMVar5);
        pmVar4 = std::
                 unordered_map<wasm::Expression_*,_unsigned_int,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>_>
                 ::operator[](&this->originalLocalMap,&pRStack_30->original);
        expression_00 =
             Builder::makeLocalGet
                       (&local_60,*pmVar4,
                        (Type)*(uintptr_t *)
                               ((long)iter.
                                      super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                                      ._M_cur + 8));
        Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
        ::replaceCurrent((Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                          *)this,(Expression *)expression_00);
        local_58->requests = local_58->requests - 1;
      }
    }
    else {
      func = Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
             ::getFunction((Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                            *)this);
      local_40 = *(uintptr_t *)
                  ((long)iter.
                         super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                         ._M_cur + 8);
      IVar2 = Builder::addVar(func,(Type)local_40);
      pmVar4 = std::
               unordered_map<wasm::Expression_*,_unsigned_int,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>_>
               ::operator[](&this->originalLocalMap,(key_type *)&iter);
      *pmVar4 = IVar2;
      local_34 = IVar2;
      pMVar5 = Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
               ::getModule((Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                            *)this);
      Builder::Builder(&local_48,pMVar5);
      originalInfo = *(mapped_type **)
                      ((long)iter.
                             super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                             ._M_cur + 8);
      expression = Builder::makeLocalTee
                             (&local_48,local_34,
                              (Expression *)
                              iter.
                              super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                              ._M_cur,(Type)originalInfo);
      Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      ::replaceCurrent((Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        *)this,(Expression *)expression);
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    auto iter = requestInfos.find(curr);
    if (iter == requestInfos.end()) {
      return;
    }

    const auto& info = iter->second;
    info.validate();

    if (info.requests) {
      // We have requests for this value. Add a local and tee the value to
      // there.
      Index local = originalLocalMap[curr] =
        Builder::addVar(getFunction(), curr->type);
      replaceCurrent(
        Builder(*getModule()).makeLocalTee(local, curr, curr->type));
    } else if (info.original) {
      auto& originalInfo = requestInfos.at(info.original);
      if (originalInfo.requests) {
        // This is a valid request of an original value. Get the value from the
        // local.
        assert(originalLocalMap.count(info.original));
        replaceCurrent(
          Builder(*getModule())
            .makeLocalGet(originalLocalMap[info.original], curr->type));
        originalInfo.requests--;
      }
    }
  }